

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O3

void __thiscall ANN::insert_layer(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  uint index;
  uint *puVar1;
  
  if (n_perceptrons->_M_len != 0) {
    puVar1 = n_perceptrons->_M_array;
    index = 0;
    do {
      insert_layer(this,index,*puVar1);
      puVar1 = puVar1 + 1;
      index = index + 1;
    } while (puVar1 != n_perceptrons->_M_array + n_perceptrons->_M_len);
  }
  return;
}

Assistant:

void ANN::insert_layer(const std::initializer_list<uint>& n_perceptrons){
    uint i=0;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        insert_layer(i++, *it);
    }
}